

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::DoStringSplit
              (Arguments *args,CallInfo *callInfo,JavascriptString *input,
              ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  CharCount limit;
  JavascriptArray *pJVar6;
  Var pvVar7;
  JavascriptRegExp *thisObj;
  JavascriptString *match;
  undefined4 *puVar8;
  RecyclableObject *this;
  
  uVar4 = *(uint *)&args->Info & 0xffffff;
  if (uVar4 == 1) {
LAB_00bbf27e:
    pJVar6 = JavascriptLibrary::CreateArray
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,1);
    JavascriptArray::DirectSetItemAt<Js::JavascriptString*>(pJVar6,0,input);
    return pJVar6;
  }
  limit = 0xffffffff;
  if (2 < uVar4) {
    pvVar7 = Arguments::operator[](args,2);
    BVar5 = JavascriptOperators::IsUndefinedObject(pvVar7);
    if (BVar5 == 0) {
      pvVar7 = Arguments::operator[](args,2);
      limit = JavascriptConversion::ToUInt32(pvVar7,scriptContext);
    }
  }
  if (((scriptContext->config).threadConfig)->m_ES6RegExSymbols == false) {
    pvVar7 = Arguments::operator[](args,1);
    bVar3 = VarIs<Js::JavascriptRegExp>(pvVar7);
    if (bVar3) {
      pvVar7 = Arguments::operator[](args,1);
      thisObj = UnsafeVarTo<Js::JavascriptRegExp>(pvVar7);
      bVar3 = RegexHelper::IsResultNotUsed((uint)(byte)callInfo->field_0x3);
      pvVar7 = RegexHelper::RegexSplit
                         (scriptContext,(RecyclableObject *)thisObj,input,limit,bVar3,(void *)0x0);
      return pvVar7;
    }
  }
  pvVar7 = Arguments::operator[](args,1);
  match = JavascriptConversion::ToString(pvVar7,scriptContext);
  if ((callInfo->field_0x3 & 0x10) != 0) {
    return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).nullValue.ptr;
  }
  if (limit == 0) {
    pJVar6 = JavascriptLibrary::CreateArray
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,0);
    return pJVar6;
  }
  pvVar7 = Arguments::operator[](args,1);
  if (pvVar7 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00bbf519;
    *puVar8 = 0;
  }
  bVar3 = TaggedInt::Is(pvVar7);
  if ((ulong)pvVar7 >> 0x32 == 0 && !bVar3) {
    this = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00bbf519;
      *puVar8 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_Undefined) goto LAB_00bbf27e;
    }
    else {
      BVar5 = RecyclableObject::IsExternal(this);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00bbf519:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
    }
  }
  pvVar7 = RegexHelper::StringSplit(match,input,limit);
  return pvVar7;
}

Assistant:

Var JavascriptString::DoStringSplit(Arguments& args, CallInfo& callInfo, JavascriptString* input, ScriptContext* scriptContext)
    {
        if (args.Info.Count == 1)
        {
            JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(1);
            ary->DirectSetItemAt(0, input);
            return ary;
        }
        else
        {
            uint32 limit;
            if (args.Info.Count < 3 || JavascriptOperators::IsUndefinedObject(args[2]))
            {
                limit = UINT_MAX;
            }
            else
            {
                limit = JavascriptConversion::ToUInt32(args[2], scriptContext);
            }

            // When the config is enabled, the operation is handled by RegExp.prototype[@@split].
            if (!scriptContext->GetConfig()->IsES6RegExSymbolsEnabled()
                && VarIs<JavascriptRegExp>(args[1]))
            {
                return RegexHelper::RegexSplit(scriptContext, UnsafeVarTo<JavascriptRegExp>(args[1]), input, limit,
                    RegexHelper::IsResultNotUsed(callInfo.Flags));
            }
            else
            {
                JavascriptString* separator = JavascriptConversion::ToString(args[1], scriptContext);

                if (callInfo.Flags & CallFlags_NotUsed)
                {
                    return scriptContext->GetLibrary()->GetNull();
                }

                if (!limit)
                {
                    JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(0);
                    return ary;
                }

                if (JavascriptOperators::GetTypeId(args[1]) == TypeIds_Undefined)
                {
                    JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(1);
                    ary->DirectSetItemAt(0, input);
                    return ary;
                }

                return RegexHelper::StringSplit(separator, input, limit);
            }
        }
    }